

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_use_manager.cpp
# Opt level: O3

void __thiscall
spvtools::opt::analysis::DefUseManager::ClearInst(DefUseManager *this,Instruction *inst)

{
  Instruction *pIVar1;
  uint32_t uVar2;
  iterator iVar3;
  const_iterator __first;
  const_iterator __last;
  Instruction *local_38;
  uint32_t local_2c;
  
  local_38 = inst;
  iVar3 = std::
          _Hashtable<const_spvtools::opt::Instruction_*,_std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<const_spvtools::opt::Instruction_*>,_std::hash<const_spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->inst_to_used_ids_)._M_h,&local_38);
  if (((iVar3.
        super__Node_iterator_base<std::pair<const_spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_false>
        ._M_cur != (__node_type *)0x0) &&
      (EraseUseRecordsOfOperandIds(this,local_38), local_38->has_result_id_ == true)) &&
     (uVar2 = Instruction::GetSingleWordOperand(local_38,(uint)local_38->has_type_id_), uVar2 != 0))
  {
    __first = UsersBegin(this,local_38);
    pIVar1 = local_38;
    for (__last._M_node = __first._M_node;
        ((_Rb_tree_header *)__last._M_node !=
         &(this->id_to_users_)._M_t._M_impl.super__Rb_tree_header &&
        (*(Instruction **)(__last._M_node + 1) == pIVar1));
        __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__last._M_node)) {
    }
    std::
    _Rb_tree<spvtools::opt::analysis::UserEntry,_spvtools::opt::analysis::UserEntry,_std::_Identity<spvtools::opt::analysis::UserEntry>,_spvtools::opt::analysis::UserEntryLess,_std::allocator<spvtools::opt::analysis::UserEntry>_>
    ::_M_erase_aux(&(this->id_to_users_)._M_t,(const_iterator)__first._M_node,__last);
    local_2c = 0;
    if (local_38->has_result_id_ == true) {
      local_2c = Instruction::GetSingleWordOperand(local_38,(uint)local_38->has_type_id_);
    }
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::_M_erase((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                *)this);
  }
  return;
}

Assistant:

void DefUseManager::ClearInst(Instruction* inst) {
  auto iter = inst_to_used_ids_.find(inst);
  if (iter != inst_to_used_ids_.end()) {
    EraseUseRecordsOfOperandIds(inst);
    if (inst->result_id() != 0) {
      // Remove all uses of this inst.
      auto users_begin = UsersBegin(inst);
      auto end = id_to_users_.end();
      auto new_end = users_begin;
      for (; UsersNotEnd(new_end, end, inst); ++new_end) {
      }
      id_to_users_.erase(users_begin, new_end);
      id_to_def_.erase(inst->result_id());
    }
  }
}